

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall lsh::vector::vector(vector *this,vector<bool,_std::allocator<bool>_> *cs)

{
  uint uVar1;
  const_reference cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_38 = &this->components_;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  iVar3 = *(int *)&(cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_finish.super__Bit_iterator_base._M_p -
          *(int *)&(cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_start.super__Bit_iterator_base._M_p;
  uVar1 = uVar6 + iVar3 * 8;
  this->size_ = uVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_38,(ulong)(uVar6 + iVar3 * 8 + 0x1f >> 5));
  for (uVar6 = 0; uVar6 <= uVar1 && uVar1 - uVar6 != 0; uVar6 = (int)uVar7 + uVar6) {
    uVar7 = (ulong)(uVar1 - uVar6);
    if (uVar6 + 0x20 <= uVar1) {
      uVar7 = 0x20;
    }
    e = 0;
    uVar5 = uVar7;
    uVar4 = uVar6;
    while (uVar5 != 0) {
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](cs,(ulong)uVar4);
      uVar5 = uVar5 - 1;
      e = e | (uint)cVar2 << ((byte)uVar5 & 0x1f);
      uVar4 = uVar4 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_38,&e);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_shrink_to_fit(local_38);
  return;
}

Assistant:

vector::vector(const std::vector<bool>& cs) {
    this->size_ = cs.size();

    unsigned int s = this->size_;
    unsigned int c = this->chunk_size_;
    unsigned int i = 0;
    unsigned int n = (s + c - 1) / c;

    this->components_.reserve(n);

    while (i < s) {
      // Compute the number of bits in the current chunk.
      unsigned int b = i + c > s ? s - i : c;

      unsigned int e = 0;

      for (unsigned int j = 0; j < b; j++) {
        e |= cs[i + j] << (b - j - 1);
      }

      this->components_.push_back(e);

      i += b;
    }

    this->components_.shrink_to_fit();
  }